

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint32 ma_dr_mp3_bs_get_bits(ma_dr_mp3_bs *bs,int n)

{
  uint uVar1;
  int iVar2;
  ma_uint8 *p;
  int shl;
  ma_uint32 s;
  ma_uint32 cache;
  ma_uint32 next;
  int n_local;
  ma_dr_mp3_bs *bs_local;
  uint local_4;
  
  cache = 0;
  uVar1 = bs->pos & 7;
  shl = n + uVar1;
  p = bs->buf + (bs->pos >> 3);
  iVar2 = n + bs->pos;
  bs->pos = iVar2;
  if (bs->limit < iVar2) {
    local_4 = 0;
  }
  else {
    next = (uint)*p & 0xff >> (sbyte)uVar1;
    while (p = p + 1, shl = shl + -8, 0 < shl) {
      cache = next << ((byte)shl & 0x1f) | cache;
      next = (ma_uint32)*p;
    }
    local_4 = cache | next >> (-(byte)shl & 0x1f);
  }
  return local_4;
}

Assistant:

static ma_uint32 ma_dr_mp3_bs_get_bits(ma_dr_mp3_bs *bs, int n)
{
    ma_uint32 next, cache = 0, s = bs->pos & 7;
    int shl = n + s;
    const ma_uint8 *p = bs->buf + (bs->pos >> 3);
    if ((bs->pos += n) > bs->limit)
        return 0;
    next = *p++ & (255 >> s);
    while ((shl -= 8) > 0)
    {
        cache |= next << shl;
        next = *p++;
    }
    return cache | (next >> -shl);
}